

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

__pid_t __thiscall
kj::Promise<kj::Own<kj::NetworkAddress>_>::wait
          (Promise<kj::Own<kj::NetworkAddress>_> *this,void *__stat_loc)

{
  WaitScope *in_RDX;
  ExceptionOr<kj::Own<kj::NetworkAddress>_> result;
  ExceptionOr<kj::Own<kj::NetworkAddress>_> local_178;
  
  local_178.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_178.value.ptr.disposer = (Disposer *)0x0;
  local_178.value.ptr.ptr = (NetworkAddress *)0x0;
  _::waitImpl((Own<kj::_::PromiseNode> *)__stat_loc,&local_178.super_ExceptionOrValue,in_RDX);
  if (local_178.value.ptr.ptr != (NetworkAddress *)0x0) {
    if (local_178.super_ExceptionOrValue.exception.ptr.isSet != false) {
      throwRecoverableException(&local_178.super_ExceptionOrValue.exception.ptr.field_1.value,0);
    }
    (this->super_PromiseBase).node.disposer = local_178.value.ptr.disposer;
    (this->super_PromiseBase).node.ptr = (PromiseNode *)local_178.value.ptr.ptr;
    local_178.value.ptr.ptr = (NetworkAddress *)0x0;
    _::ExceptionOr<kj::Own<kj::NetworkAddress>_>::~ExceptionOr(&local_178);
    return (__pid_t)this;
  }
  if (local_178.super_ExceptionOrValue.exception.ptr.isSet != false) {
    throwFatalException(&local_178.super_ExceptionOrValue.exception.ptr.field_1.value,0);
  }
  _::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }